

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O2

int X509V3_bool_from_string(char *str,ASN1_BOOLEAN *out_bool)

{
  char cVar1;
  int iVar2;
  
  iVar2 = strcmp(str,"TRUE");
  if ((((iVar2 == 0) || (iVar2 = strcmp(str,"true"), iVar2 == 0)) ||
      (((cVar1 = *str, cVar1 == 'y' || (cVar1 == 'Y')) && (str[1] == '\0')))) ||
     ((iVar2 = strcmp(str,"YES"), iVar2 == 0 || (iVar2 = strcmp(str,"yes"), iVar2 == 0)))) {
    *out_bool = 0xff;
    return 1;
  }
  iVar2 = strcmp(str,"FALSE");
  if ((iVar2 != 0) && (iVar2 = strcmp(str,"false"), iVar2 != 0)) {
    if (cVar1 == 'n') {
      if (str[1] == '\0') goto LAB_00414700;
      if (str[1] != 'o') goto LAB_004146e2;
    }
    else {
      if (cVar1 != 'N') goto LAB_004146e2;
      if (str[1] == '\0') goto LAB_00414700;
      if (str[1] != 'O') goto LAB_004146e2;
    }
    if (str[2] != '\0') {
LAB_004146e2:
      ERR_put_error(0x14,0,0x78,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_utl.cc"
                    ,0x109);
      return 0;
    }
  }
LAB_00414700:
  *out_bool = 0;
  return 1;
}

Assistant:

int X509V3_bool_from_string(const char *str, ASN1_BOOLEAN *out_bool) {
  if (!strcmp(str, "TRUE") || !strcmp(str, "true") || !strcmp(str, "Y") ||
      !strcmp(str, "y") || !strcmp(str, "YES") || !strcmp(str, "yes")) {
    *out_bool = ASN1_BOOLEAN_TRUE;
    return 1;
  }
  if (!strcmp(str, "FALSE") || !strcmp(str, "false") || !strcmp(str, "N") ||
      !strcmp(str, "n") || !strcmp(str, "NO") || !strcmp(str, "no")) {
    *out_bool = ASN1_BOOLEAN_FALSE;
    return 1;
  }
  OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_BOOLEAN_STRING);
  return 0;
}